

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
EnrichableI2cAnalyzerSettings::EnrichableI2cAnalyzerSettings(EnrichableI2cAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_02;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_03;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_04;
  auto_ptr<AnalyzerSettingInterfaceText> *this_05;
  AnalyzerSettingInterfaceChannel *pAVar1;
  AnalyzerSettingInterfaceNumberList *this_06;
  AnalyzerSettingInterfaceText *this_07;
  ulong uVar2;
  Channel *pCVar3;
  char *pcVar4;
  uint uVar5;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__EnrichableI2cAnalyzerSettings_00110d28;
  this_00 = &this->mSdaChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mSclChannel;
  uVar2 = 0xffffffffffffffff;
  Channel::Channel(this_01,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mAddressDisplay = YES_DIRECTION_8;
  this->mParserCommand = "";
  this_02 = &this->mSdaChannelInterface;
  this_03 = &this->mSclChannelInterface;
  this_04 = &this->mAddressDisplayInterface;
  this_05 = &this->mParserCommandInterface;
  (this->mSdaChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mSclChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mAddressDisplayInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mParserCommandInterface)._M_ptr = (AnalyzerSettingInterfaceText *)0x0;
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_02,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"SDA");
  pCVar3 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_02->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_03,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"SCL");
  pCVar3 = this_01;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_03->_M_ptr);
  this_06 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar3);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_06);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_04,this_06);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04->_M_ptr,"Address Display");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)this_04->_M_ptr,"8-bit, read/write bit included [default]");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_04->_M_ptr,"8-bit, read/write bit set as 0");
  pcVar4 = "7-bit, address bits only";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_04->_M_ptr,"7-bit, address bits only");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mAddressDisplay);
  this_07 = (AnalyzerSettingInterfaceText *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar4);
  AnalyzerSettingInterfaceText::AnalyzerSettingInterfaceText(this_07);
  std::auto_ptr<AnalyzerSettingInterfaceText>::reset(this_05,this_07);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05->_M_ptr,"Enrichment Script");
  AnalyzerSettingInterfaceText::SetTextType((TextType)this_05->_M_ptr);
  AnalyzerSettingInterfaceText::SetText((char *)(this->mParserCommandInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  return;
}

Assistant:

EnrichableI2cAnalyzerSettings::EnrichableI2cAnalyzerSettings()
:	mSdaChannel( UNDEFINED_CHANNEL ),
	mSclChannel( UNDEFINED_CHANNEL ),
	mAddressDisplay( YES_DIRECTION_8 ),
	mParserCommand("")
{
	mSdaChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mSdaChannelInterface->SetTitleAndTooltip( "SDA", "Serial Data Line" );
	mSdaChannelInterface->SetChannel( mSdaChannel );

	mSclChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mSclChannelInterface->SetTitleAndTooltip( "SCL", "Serial Clock Line" );
	mSclChannelInterface->SetChannel( mSclChannel );

	mAddressDisplayInterface.reset( new AnalyzerSettingInterfaceNumberList() );
	mAddressDisplayInterface->SetTitleAndTooltip( "Address Display", "Specify how you would like the I2C address to be displayed." );
	mAddressDisplayInterface->AddNumber( YES_DIRECTION_8, "8-bit, read/write bit included [default]", "Displays the address as it would be seen in a microcontroller register (with the read/write bit included)" );
	mAddressDisplayInterface->AddNumber( NO_DIRECTION_8, "8-bit, read/write bit set as 0", "Displays the I2C address as an 8 bit number, but uses 0 in place of the read/write bit" );
	mAddressDisplayInterface->AddNumber( NO_DIRECTION_7, "7-bit, address bits only", "Displays the I2C address as a 7-bit number" );
	mAddressDisplayInterface->SetNumber( mAddressDisplay );

	mParserCommandInterface.reset(new AnalyzerSettingInterfaceText());
	mParserCommandInterface->SetTitleAndTooltip("Enrichment Script", "Command to run for enriching displayed I2C data.");
	mParserCommandInterface->SetTextType(AnalyzerSettingInterfaceText::NormalText);
	mParserCommandInterface->SetText(mParserCommand);

	AddInterface( mSdaChannelInterface.get() );
	AddInterface( mSclChannelInterface.get() );
	AddInterface( mAddressDisplayInterface.get() );
	AddInterface( mParserCommandInterface.get() );

	//AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	AddChannel( mSdaChannel, "SDA", false );
	AddChannel( mSclChannel, "SCL", false );
}